

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::SkipWhitespace(AsciiParser *this)

{
  int *piVar1;
  StreamReader *pSVar2;
  bool bVar3;
  ulong uVar4;
  char c;
  byte local_19;
  
  while (bVar3 = Eof(this), !bVar3) {
    bVar3 = Char1(this,(char *)&local_19);
    if (!bVar3) {
      return false;
    }
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    if ((0x20 < (ulong)local_19) || ((0x100001200U >> ((ulong)local_19 & 0x3f) & 1) == 0)) break;
  }
  pSVar2 = this->_sr;
  bVar3 = false;
  if ((0 < (long)pSVar2->idx_) &&
     (uVar4 = pSVar2->idx_ - 1, bVar3 = false, uVar4 <= pSVar2->length_)) {
    pSVar2->idx_ = uVar4;
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + -1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool AsciiParser::SkipWhitespace() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }
    _curr_cursor.col++;

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      // continue
    } else {
      break;
    }
  }

  // unwind 1 char
  if (!_sr->seek_from_current(-1)) {
    return false;
  }
  _curr_cursor.col--;

  return true;
}